

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

double hermite_integral(int n)

{
  double dVar1;
  double dVar2;
  undefined8 local_20;
  double value;
  double r8_pi;
  int n_local;
  
  if (n < 0) {
    local_20 = r8_huge();
    local_20 = -local_20;
  }
  else if (n % 2 == 1) {
    local_20 = 0.0;
  }
  else {
    dVar1 = r8_factorial2(n + -1);
    dVar2 = sqrt(3.141592653589793);
    local_20 = pow(2.0,(double)(n / 2));
    local_20 = (dVar1 * dVar2) / local_20;
  }
  return local_20;
}

Assistant:

double hermite_integral ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_INTEGRAL evaluates a monomial Hermite integral.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -oo < x < +oo ) x^n exp(-x^2) dx
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    19 February 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the integral.  
//    0 <= N.
//
//    Output, double VALUE, the value of the integral.
//
{
  const double r8_pi = 3.141592653589793;
  double value;

  if ( n < 0 )
  {
    value = - r8_huge ( );
  }
  else if ( ( n % 2 ) == 1 )
  {
    value = 0.0;
  }
  else
  {
    value = r8_factorial2 ( n - 1 ) * sqrt ( r8_pi ) / pow ( 2.0, n / 2 );
  }

  return value;
}